

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can_implicitly_cast.cpp
# Opt level: O1

ScalarFunction * duckdb::CanCastImplicitlyFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff2c;
  FunctionNullHandling in_stack_ffffffffffffff38;
  bind_lambda_function_t in_stack_ffffffffffffff40;
  scalar_function_t local_b8;
  LogicalType local_90;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  LogicalType local_60;
  LogicalType local_48 [2];
  
  LogicalType::LogicalType(local_48,ANY);
  LogicalType::LogicalType(local_48 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_48;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_78,__l,(allocator_type *)&stack0xffffffffffffff47);
  LogicalType::LogicalType(&local_90,BOOLEAN);
  local_b8.super__Function_base._M_functor._8_8_ = 0;
  local_b8.super__Function_base._M_functor._M_unused._M_object = CanCastImplicitlyFunction;
  local_b8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_b8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_60,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_60;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff24;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff2c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_78,&local_90,&local_b8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  LogicalType::~LogicalType(&local_60);
  if (local_b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.super__Function_base._M_manager)
              ((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_90);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_48[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  in_RDI->bind_expression = BindCanCastImplicitlyExpression;
  return in_RDI;
}

Assistant:

ScalarFunction CanCastImplicitlyFun::GetFunction() {
	auto fun = ScalarFunction({LogicalType::ANY, LogicalType::ANY}, LogicalType::BOOLEAN, CanCastImplicitlyFunction);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.bind_expression = BindCanCastImplicitlyExpression;
	return fun;
}